

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O3

ncnn_datareader_t ncnn_datareader_create(void)

{
  ncnn_datareader_t p_Var1;
  DataReader *this;
  
  p_Var1 = (ncnn_datareader_t)malloc(0x18);
  this = (DataReader *)operator_new(0x10);
  ncnn::DataReader::DataReader(this);
  this->_vptr_DataReader = (_func_int **)&PTR__DataReader_005bfed0;
  this[1]._vptr_DataReader = (_func_int **)p_Var1;
  p_Var1->pthis = this;
  p_Var1->scan = __ncnn_DataReader_scan;
  p_Var1->read = __ncnn_DataReader_read;
  return p_Var1;
}

Assistant:

ncnn_datareader_t ncnn_datareader_create()
{
    ncnn_datareader_t dr = (ncnn_datareader_t)malloc(sizeof(struct __ncnn_datareader_t));
    dr->pthis = (void*)(new DataReader_c_api(dr));
#if NCNN_STRING
    dr->scan = __ncnn_DataReader_scan;
#endif /* NCNN_STRING */
    dr->read = __ncnn_DataReader_read;
    return dr;
}